

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O0

bool basisu::etc_block::unpack_color5
               (uint32_t *r,uint32_t *g,uint32_t *b,uint16_t packed_color5,uint16_t packed_delta3,
               bool scaled,uint32_t alpha)

{
  bool bVar1;
  undefined2 in_CX;
  anon_union_4_2_6eba8969_for_color_rgba_0 aVar2;
  uint *in_RDX;
  anon_union_4_2_6eba8969_for_color_rgba_0 *in_RSI;
  uint *in_RDI;
  undefined2 in_R8W;
  byte in_R9B;
  bool success;
  color_rgba result;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_21;
  byte local_1d;
  uint32_t alpha_00;
  
  alpha_00 = CONCAT22(in_CX,in_R8W);
  local_1d = in_R9B & 1;
  color_rgba::color_rgba((color_rgba *)&local_21.field_1);
  bVar1 = unpack_color5((color_rgba *)&in_RSI->field_1,(uint16_t)((ulong)in_RDX >> 0x30),
                        (uint16_t)((ulong)in_RDX >> 0x20),SUB81((ulong)in_RDX >> 0x18,0),alpha_00);
  *in_RDI = (uint)local_21.m_comps[0];
  aVar2._1_3_ = 0;
  aVar2.m_comps[0] = local_21.m_comps[1];
  *in_RSI = aVar2;
  *in_RDX = (uint)local_21.m_comps[2];
  return bVar1;
}

Assistant:

bool etc_block::unpack_color5(uint32_t& r, uint32_t& g, uint32_t& b, uint16_t packed_color5, uint16_t packed_delta3, bool scaled, uint32_t alpha)
	{
		color_rgba result;
		const bool success = unpack_color5(result, packed_color5, packed_delta3, scaled, alpha);
		r = result.r;
		g = result.g;
		b = result.b;
		return success;
	}